

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTester.cpp
# Opt level: O2

void __thiscall HTester::testUpdate(HTester *this,int item)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint iCol;
  uint uVar3;
  pointer piVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  bool bVar12;
  int i;
  long lVar13;
  undefined4 uVar14;
  int iVar15;
  double dVar16;
  int iVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int rowOut;
  vector<int,_std::allocator<int>_> look;
  int fakeHint;
  HVector row_ep;
  string itemNames [5];
  HVector column;
  HTimer timer;
  int local_890;
  byte local_88a;
  byte local_889;
  double local_888;
  double local_880;
  double local_878;
  int local_86c;
  int local_868;
  int local_864;
  int local_860;
  int local_85c;
  double local_858;
  string *local_850;
  double local_848;
  double local_840;
  double local_838;
  double local_830;
  double local_828;
  double local_820;
  double local_818;
  double local_810;
  double local_808;
  int local_7fc;
  double local_7f8;
  HMatrix *local_7f0;
  HModel *local_7e8;
  HFactor *local_7e0;
  _Vector_base<int,_std::allocator<int>_> local_7d8;
  double local_7c0;
  double local_7b8;
  double local_7b0;
  double local_7a8;
  double local_7a0;
  double local_798;
  double local_790;
  double local_788;
  double local_780;
  double local_778;
  int local_76c;
  double local_768;
  double dStack_760;
  double local_758;
  double dStack_750;
  double local_748;
  double dStack_740;
  HVector local_730;
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  HVector local_5d8;
  HTimer local_520;
  
  if (item == 5) {
    testCFT(this);
    return;
  }
  std::__cxx11::string::string(local_678,"",(allocator *)&local_520);
  std::__cxx11::string::string(local_658,"FT",(allocator *)&local_5d8);
  std::__cxx11::string::string(local_638,"PF",(allocator *)&local_730);
  std::__cxx11::string::string(local_618,"MPF",(allocator *)&local_7d8);
  std::__cxx11::string::string(local_5f8,"APF",(allocator *)&local_890);
  HTimer::HTimer(&local_520);
  HTimer::reset(&local_520);
  iVar15 = (this->model).numRow;
  iVar17 = (this->model).numTot;
  local_5d8.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5d8.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5d8.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_5d8.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5d8.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_5d8.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_5d8.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_5d8.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_5d8.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_5d8.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_5d8.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_5d8.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_5d8.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_5d8.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_5d8.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_5d8.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5d8.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5d8.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_730.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_730.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_730.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_730.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_730.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (int *)0x0;
  local_730.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_730.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_730.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_730.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_730.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_730.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_730.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_730.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_730.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_730.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_730.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_730.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_730.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HVector::setup(&local_5d8,iVar15);
  HVector::setup(&local_730,iVar15);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_7d8,(long)iVar17,
             (allocator_type *)&local_890);
  local_7e8 = &this->model;
  piVar4 = (this->model).basicIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  HModel::changeUpdate(local_7e8,item);
  uVar5 = rdtsc();
  uVar14 = (undefined4)((ulong)uVar5 >> 0x20);
  auVar7._4_4_ = uVar14;
  auVar7._0_4_ = uVar14;
  auVar7._8_4_ = 0;
  auVar19._0_12_ = auVar7 << 0x20;
  auVar19._12_4_ = 0x45300000;
  dStack_760 = auVar19._8_8_ - 1.9342813113834067e+25;
  local_768 = dStack_760 + ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0);
  local_858 = local_520.startTick;
  local_7f8 = HTimer::getTime(&local_520);
  local_7e0 = &(this->model).factor;
  local_808 = (double)iVar15;
  local_7f0 = &(this->model).matrix;
  local_850 = local_678 + (long)item * 0x20;
  dVar16 = 0.0;
  local_828 = 0.0;
  local_830 = 0.0;
  local_820 = 1.0;
  local_810 = 0.0;
  local_840 = 0.0;
  local_86c = 0;
  iVar15 = 0;
  local_838 = 0.0;
  iVar17 = 0;
  local_864 = 0;
  local_868 = 0;
  local_860 = 0;
  local_848 = 0.0;
  local_818 = 0.0;
  local_880 = 0.0;
  local_878 = 0.0;
  while( true ) {
    if ((long)this->numPivot <= (long)dVar16) break;
    iCol = (this->historyIn).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[(long)dVar16];
    uVar3 = (this->historyOut).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(long)dVar16];
    local_85c = iVar15;
    if ((iCol & uVar3) == 0xffffffff) {
      local_888 = HTimer::getTime(&local_520);
      if (100.0 < local_888 - local_7f8) {
        printf("Model=%-16s  item=%-3s  time=%-6.0f  where=%-3.0f\n",local_888,
               ((double)SUB84(dVar16,0) * 100.0) / (double)this->numPivot,
               (this->modelName)._M_dataplus._M_p,*(undefined8 *)local_850);
        fflush(_stdout);
        local_7f8 = local_888;
      }
      uVar5 = rdtsc();
      local_888 = local_520.startTick;
      HModel::computeFactor(local_7e8);
      auVar20._8_4_ = (int)((ulong)uVar5 >> 0x20);
      auVar20._0_8_ = uVar5;
      auVar20._12_4_ = 0x45300000;
      uVar6 = rdtsc();
      uVar14 = (undefined4)((ulong)uVar6 >> 0x20);
      auVar8._4_4_ = uVar14;
      auVar8._0_4_ = uVar14;
      auVar8._8_4_ = 0;
      auVar21._0_12_ = auVar8 << 0x20;
      auVar21._12_4_ = 0x45300000;
      for (lVar13 = 0; lVar13 < (this->model).numRow; lVar13 = lVar13 + 1) {
        local_7d8._M_impl.super__Vector_impl_data._M_start[piVar4[lVar13]] = (int)lVar13;
      }
      uVar1 = (this->model).factor.BtotalX;
      uVar2 = (this->model).factor.FtotalX;
      local_810 = local_810 +
                  (local_888 -
                  ((auVar20._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0))) +
                  (((auVar21._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) -
                  local_520.startTick);
      dVar18 = log((double)(int)uVar2 / (double)(int)uVar1);
      local_818 = local_818 + dVar18;
      local_860 = local_860 + 1;
      iVar15 = local_85c + 1;
    }
    else {
      local_890 = local_7d8._M_impl.super__Vector_impl_data._M_start[(int)uVar3];
      uVar5 = rdtsc();
      uVar14 = (undefined4)((ulong)uVar5 >> 0x20);
      auVar9._4_4_ = uVar14;
      auVar9._0_4_ = uVar14;
      auVar9._8_4_ = 0;
      auVar22._0_12_ = auVar9 << 0x20;
      auVar22._12_4_ = 0x45300000;
      local_748 = (double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0;
      dStack_740 = auVar22._8_8_ - 1.9342813113834067e+25;
      local_778 = local_520.startTick;
      local_888 = dVar16;
      HVector::clear(&local_730);
      local_730.packFlag = true;
      local_730.count = 1;
      *local_730.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start = local_890;
      local_730.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[local_890] = 1.0;
      HFactor::btran(local_7e0,&local_730,local_880);
      HVector::tight(&local_730);
      local_780 = ((double)local_730.count / local_808) * 0.05;
      local_880 = local_880 * 0.95;
      local_889 = (double)local_730.count / local_808 < 0.1;
      local_7fc = iVar17;
      HVector::clear(&local_5d8);
      local_5d8.packFlag = true;
      HMatrix::collect_aj(local_7f0,&local_5d8,iCol,1.0);
      HFactor::ftran(local_7e0,&local_5d8,local_878);
      HVector::tight(&local_5d8);
      local_788 = (double)local_5d8.count / local_808;
      local_7a8 = local_788 * 0.05;
      local_88a = local_788 < 0.1;
      local_7a0 = (double)local_5d8.packCount;
      local_798 = (double)local_730.packCount;
      local_878 = local_878 * 0.95;
      local_790 = (double)local_730.count;
      local_820 = local_820 + 1.0;
      HModel::updateFactor(local_7e8,&local_5d8,&local_730,&local_890,&local_76c);
      uVar5 = rdtsc();
      uVar14 = (undefined4)((ulong)uVar5 >> 0x20);
      auVar10._4_4_ = uVar14;
      auVar10._0_4_ = uVar14;
      auVar10._8_4_ = 0;
      auVar23._0_12_ = auVar10 << 0x20;
      auVar23._12_4_ = 0x45300000;
      dStack_750 = auVar23._8_8_ - 1.9342813113834067e+25;
      local_758 = (dStack_750 + ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) -
                  local_520.startTick;
      local_7b0 = (this->historyAlpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)local_888];
      local_7b8 = HMatrix::compute_dot(local_7f0,&local_730,iCol);
      iVar15 = local_890;
      local_7c0 = local_5d8.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[local_890];
      bVar12 = diff_double(local_7c0,local_7b8);
      if (bVar12) {
        printf("Model=%-16s  item=%-3s  diff: ip=%d %f %f %f\n",local_7b0,local_7c0,local_7b8,
               (this->modelName)._M_dataplus._M_p,*(undefined8 *)local_850,local_888);
        iVar15 = local_890;
      }
      local_880 = local_880 + local_780;
      local_878 = local_878 + local_7a8;
      local_848 = local_848 + local_7a0 / local_808;
      local_838 = local_838 + local_798 / local_808;
      local_828 = local_828 + local_788;
      local_830 = local_830 + local_790 / local_808;
      local_840 = local_840 + (local_778 - (dStack_740 + local_748)) + local_758;
      local_86c = local_86c + 1;
      local_864 = local_864 + (uint)local_889;
      local_868 = local_868 + (uint)local_88a;
      iVar17 = local_7fc + 1;
      local_7d8._M_impl.super__Vector_impl_data._M_start[(int)iCol] = iVar15;
      piVar4[local_890] = iCol;
      dVar16 = local_888;
      iVar15 = local_85c;
    }
    dVar16 = (double)((long)dVar16 + 1);
  }
  uVar5 = rdtsc();
  uVar14 = (undefined4)((ulong)uVar5 >> 0x20);
  auVar11._4_4_ = uVar14;
  auVar11._0_4_ = uVar14;
  auVar11._8_4_ = 0;
  auVar24._0_12_ = auVar11 << 0x20;
  auVar24._12_4_ = 0x45300000;
  local_858 = (local_858 - local_768) +
              (((auVar24._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) - local_520.startTick
              );
  local_880 = HTimer::getTime(&local_520);
  dVar16 = exp(local_818 / (double)local_860);
  printf("Model=%-16s  item=%-3s  fill=%f  interval=%d FTRAN=%10f  BTRAN=%10f  Fpack=%10.9f  Bpack=%10.9f  Ffull=%10.9f  Bfull=%10.9f  inv=%f  sol=%f\n"
         ,dVar16,((double)local_868 * 100.0) / (double)iVar17,
         ((double)local_864 * 100.0) / (double)iVar17,local_848 / local_820,local_838 / local_820,
         local_828 / local_820,local_830 / local_820,(local_810 * local_880) / local_858,
         (this->modelName)._M_dataplus._M_p,*(undefined8 *)local_850,
         (ulong)(uint)(int)((double)local_86c / (double)(iVar15 + -1)));
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_7d8);
  HVector::~HVector(&local_730);
  HVector::~HVector(&local_5d8);
  HTimer::~HTimer(&local_520);
  lVar13 = 0x80;
  do {
    std::__cxx11::string::~string(local_678 + lVar13);
    lVar13 = lVar13 + -0x20;
  } while (lVar13 != -0x20);
  return;
}

Assistant:

void HTester::testUpdate(int item) {
    if (item == 5) {
        testCFT();
        return;
    }

    string itemNames[] = { "", "FT", "PF", "MPF", "APF" };

    HTimer timer;
    timer.reset();
    const int numRow = model.getNumRow();
    const int numTot = model.getNumTot();
    HVector column;
    HVector row_ep;
    column.setup(numRow);
    row_ep.setup(numRow);
    double column_dsty = 0;
    double row_ep_dsty = 0;

    vector<int> look(numTot);
    int *base = model.getBaseIndex();

    model.changeUpdate(item);

    double sumLnRate = 0;
    int countRate = 0;

    int countFTRAN = 0;
    int countBTRAN = 0;
    int countTotal = 0;

    double sumFTRANpack = 0;
    double sumBTRANpack = 0;
    double sumFTRANfull = 0;
    double sumBTRANfull = 0;
    double countSolve = 1;

    double invTick = 0;
    double solTick = 0;

    double totalTick = timer.getTick();
    double lastReportTime = timer.getTime();

    int totalUpdate = 0;
    int totalInvert = 0;

    for (int ip = 0; ip < numPivot; ip++) {
        // Refactor
        int columnIn = historyIn[ip];
        int columnOut = historyOut[ip];
        if (columnIn == -1 && columnOut == -1) {
            double time = timer.getTime();
            if (time - lastReportTime > 100) {
                printf("Model=%-16s  item=%-3s  time=%-6.0f  where=%-3.0f\n",
                        modelName.c_str(), itemNames[item].c_str(), time,
                        ((100.0 * ip) / numPivot));
                fflush(stdout);
                lastReportTime = time;
            }

            double tick1 = timer.getTick();
            model.computeFactor();
            invTick += timer.getTick() - tick1;
            for (int i = 0; i < model.getNumRow(); i++)
                look[base[i]] = i;

            double myRate = 1.0 * model.getFactor()->FtotalX
                    / model.getFactor()->BtotalX;
            sumLnRate += log(myRate);
            countRate++;

            totalInvert++;

            continue;
        }
        totalUpdate++;

        // The row out
        int rowOut = look[columnOut];

        double tick2 = timer.getTick();

        // Compute BTRAN
        row_ep.clear();
        row_ep.packFlag = true;
        row_ep.count = 1;
        row_ep.index[0] = rowOut;
        row_ep.array[rowOut] = 1;
        model.getFactor()->btran(row_ep, row_ep_dsty);
        row_ep.tight();
        double BTRANdsty = 1.0 * row_ep.count / numRow;
        row_ep_dsty = 0.95 * row_ep_dsty + 0.05 * BTRANdsty;
        countBTRAN += BTRANdsty < 0.1;

        // Compute FTRAN
        column.clear();
        column.packFlag = true;
        model.getMatrix()->collect_aj(column, columnIn, 1);
        model.getFactor()->ftran(column, column_dsty);
        column.tight();
        double FTRANdsty = 1.0 * column.count / numRow;
        column_dsty = 0.95 * column_dsty + 0.05 * FTRANdsty;
        countFTRAN += FTRANdsty < 0.1;
        countTotal++;

        sumFTRANpack += 1.0 * column.packCount / numRow;
        sumBTRANpack += 1.0 * row_ep.packCount / numRow;
        sumFTRANfull += 1.0 * column.count / numRow;
        sumBTRANfull += 1.0 * row_ep.count / numRow;
        countSolve ++;

        // Update factor
        int fakeHint;
        model.updateFactor(&column, &row_ep, &rowOut, &fakeHint);

        solTick += timer.getTick() - tick2;

        // Compare results
        double alpha = historyAlpha[ip];
        double alphaBTRAN = model.getMatrix()->compute_dot(row_ep, columnIn);
        double alphaFTRAN = column.array[rowOut];
        if (diff_double(alphaFTRAN, alphaBTRAN)) {
            printf("Model=%-16s  item=%-3s  diff: ip=%d %f %f %f\n",
                    modelName.c_str(), itemNames[item].c_str(), ip, alpha,
                    alphaFTRAN, alphaBTRAN);
        }

        // Update the basis
        look[columnIn] = rowOut;
        base[rowOut] = columnIn;
    }
    totalTick = timer.getTick() - totalTick;
    double totalTime = timer.getTime();
    double rate = exp(sumLnRate / countRate);
    printf(
            "Model=%-16s  item=%-3s  fill=%f  interval=%d FTRAN=%10f  BTRAN=%10f  Fpack=%10.9f  Bpack=%10.9f  Ffull=%10.9f  Bfull=%10.9f  inv=%f  sol=%f\n",
            modelName.c_str(), itemNames[item].c_str(), rate,
            (int) (1.0 * totalUpdate / (totalInvert - 1)),
            100.0 * countFTRAN / countTotal, 100.0 * countBTRAN / countTotal,
            sumFTRANpack / countSolve,
            sumBTRANpack / countSolve,
            sumFTRANfull / countSolve,
            sumBTRANfull / countSolve,
            totalTime * invTick / totalTick,
            totalTime * solTick / totalTick);
}